

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QList<unsigned_long_long> * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::keys
          (QList<unsigned_long_long> *__return_storage_ptr__,
          QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this)

{
  key_iterator i1;
  key_iterator i2;
  ulong uVar1;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *pDVar2;
  ulong uVar3;
  uchar *puVar4;
  long in_FS_OFFSET;
  
  pDVar2 = this->d;
  if (pDVar2 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                 *)0x0) {
    pDVar2 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
    uVar3 = 0;
  }
  else {
    if (pDVar2->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar2->numBuckets == uVar3) {
          pDVar2 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                    *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    }
    else {
      uVar3 = 0;
    }
    if (pDVar2 != (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                   *)0x0) {
      puVar4 = pDVar2->spans[uVar3 >> 7].entries
               [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data + 8;
      goto LAB_0013d7ce;
    }
  }
  puVar4 = (uchar *)0x0;
LAB_0013d7ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  i1.i.i.bucket = uVar3;
  i1.i.i.d = pDVar2;
  i1.i.e = (Chain **)puVar4;
  i2.i.e = (Chain **)0x0;
  i2.i.i.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
  i2.i.i.bucket = 0;
  QList<unsigned_long_long>::
  QList<QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::key_iterator,_true>
            (__return_storage_ptr__,i1,i2);
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }